

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O3

void output_conll(vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *pos,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *sentenceUnkStrings,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToWords,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToPos,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *hyp,
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *rel_hyp)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  _Rb_tree_color _Var3;
  mapped_type mVar4;
  pointer puVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  pointer pbVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  ostream *poVar13;
  _Rb_tree_header *p_Var14;
  _Base_ptr p_Var15;
  uint uVar16;
  char cVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hyp_rel;
  string wit;
  key_type local_d0;
  key_type local_b0;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  string local_88;
  undefined7 uStack_87;
  undefined1 local_78 [16];
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  _Rb_tree_header *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  puVar5 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_90 = intToWords;
  local_68 = intToPos;
  local_60 = hyp;
  local_58 = pos;
  if ((long)(sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5 != 4) {
    p_Var14 = &(intToWords->_M_t)._M_impl.super__Rb_tree_header;
    local_40 = &(intToPos->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = &(hyp->_M_t)._M_impl.super__Rb_tree_header;
    local_48 = &(rel_hyp->_M_t)._M_impl.super__Rb_tree_header;
    uVar18 = 0;
    uVar16 = 0;
    local_50 = sentence;
    do {
      if ((ulong)((long)(sentenceUnkStrings->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sentenceUnkStrings->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar18)
      goto LAB_0017c696;
      mVar2 = puVar5[uVar18];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"UNK","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&corpus.wordsToInt,&local_b0);
      mVar4 = *pmVar6;
      if (mVar4 == 0) {
        *pmVar6 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar7 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&corpus.intToWords,pmVar6);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        corpus.nwords = corpus.max;
        mVar4 = *pmVar6;
      }
      if ((mVar2 != mVar4) ||
         ((sentenceUnkStrings->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length == 0)) {
        mVar2 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar18];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"UNK","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&corpus.wordsToInt,&local_d0);
        mVar4 = *pmVar6;
        if (mVar4 == 0) {
          *pmVar6 = corpus.max;
          corpus.max = corpus.max + 1;
          pmVar7 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&corpus.intToWords,pmVar6);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          corpus.nwords = corpus.max;
          mVar4 = *pmVar6;
        }
        if (((mVar2 == mVar4) ||
            ((sentenceUnkStrings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length != 0)) ||
           (p_Var11 = (local_90->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
           p_Var11 == (_Base_ptr)0x0)) {
LAB_0017c696:
          __assert_fail("i < sentenceUnkStrings.size() && ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() > 0) || (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() == 0 && intToWords.find(sentence[i]) != intToWords.end()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                        ,0x36a,
                        "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                       );
        }
        _Var3 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar18];
        p_Var8 = &p_Var14->_M_header;
        do {
          bVar20 = p_Var11[1]._M_color < _Var3;
          if (!bVar20) {
            p_Var8 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[bVar20];
        } while (p_Var11 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 == p_Var14) || (_Var3 < p_Var8[1]._M_color))
        goto LAB_0017c696;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pbVar9 = (sentenceUnkStrings->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Var11 = (_Base_ptr)pbVar9[uVar18]._M_string_length;
      if (p_Var11 == (_Base_ptr)0x0) {
        p_Var11 = (local_90->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var14->_M_header;
        if (p_Var11 != (_Base_ptr)0x0) {
          _Var3 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar18];
          p_Var10 = &p_Var14->_M_header;
          do {
            bVar20 = p_Var11[1]._M_color < _Var3;
            if (!bVar20) {
              p_Var10 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[bVar20];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var10 != p_Var14) &&
             (p_Var8 = p_Var10, _Var3 < p_Var10[1]._M_color)) {
            p_Var8 = &p_Var14->_M_header;
          }
        }
        p_Var11 = p_Var8[1]._M_left;
        pbVar9 = (pointer)&p_Var8[1]._M_parent;
      }
      else {
        pbVar9 = pbVar9 + uVar18;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      p_Var8 = (_Base_ptr)(pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,p_Var8,(long)&p_Var8->_M_color + (long)&p_Var11->_M_color);
      p_Var11 = (local_68->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = local_40;
      if (p_Var11 != (_Base_ptr)0x0) {
        _Var3 = (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar18];
        p_Var10 = local_40;
        do {
          bVar20 = p_Var11[1]._M_color < _Var3;
          if (!bVar20) {
            p_Var10 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[bVar20];
        } while (p_Var11 != (_Base_ptr)0x0);
        if ((p_Var10 != local_40) && (p_Var8 = p_Var10, _Var3 < p_Var10[1]._M_color)) {
          p_Var8 = local_40;
        }
      }
      p_Var11 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_0017c6b5:
        __assert_fail("hyp.find(i) != hyp.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                      ,0x36e,
                      "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                     );
      }
      p_Var10 = p_Var11;
      p_Var15 = &p_Var1->_M_header;
      do {
        if ((int)uVar16 <= (int)p_Var10[1]._M_color) {
          p_Var15 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < (int)uVar16];
      } while (p_Var10 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
         (p_Var10 = &p_Var1->_M_header, (int)uVar16 < (int)p_Var15[1]._M_color)) goto LAB_0017c6b5;
      do {
        if ((int)uVar16 <= (int)p_Var11[1]._M_color) {
          p_Var10 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)uVar16];
      } while (p_Var11 != (_Base_ptr)0x0);
      p_Var11 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var11 = p_Var10, (int)uVar16 < (int)p_Var10[1]._M_color)) {
        p_Var11 = &p_Var1->_M_header;
      }
      iVar19 = *(int *)&p_Var11[1].field_0x4 + 1;
      if (iVar19 == (int)((ulong)((long)(sentence->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(sentence->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 2)) {
        iVar19 = 0;
      }
      p_Var11 = (rel_hyp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = local_48;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_0017c6d4:
        __assert_fail("hyp_rel_it != rel_hyp.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                      ,0x372,
                      "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                     );
      }
      do {
        if ((int)uVar16 <= (int)*(size_t *)(p_Var11 + 1)) {
          p_Var12 = (_Rb_tree_header *)p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)uVar16];
      } while (p_Var11 != (_Base_ptr)0x0);
      if ((p_Var12 == local_48) || ((int)uVar16 < (int)p_Var12->_M_node_count)) goto LAB_0017c6d4;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_38 = p_Var8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(p_Var12 + 1),
                 *(long *)(p_Var12 + 1) + *(long *)((long)(p_Var12 + 1) + 8));
      cVar17 = (char)&local_d0;
      std::__cxx11::string::find(cVar17,0x28);
      std::__cxx11::string::rfind(cVar17,0x29);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_d0);
      std::__cxx11::string::operator=((string *)&local_d0,&local_88);
      if ((undefined1 *)CONCAT71(uStack_87,local_88) != local_78) {
        operator_delete((undefined1 *)CONCAT71(uStack_87,local_88));
      }
      uVar18 = (ulong)(uVar16 + 1);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"_",1);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"_",1);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(char *)local_38[1]._M_parent,(long)local_38[1]._M_left);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"_",1);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar19);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"_",1);
      local_88 = (string)0x9;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"_",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      sentence = local_50;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      puVar5 = (sentence->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = uVar16 + 1;
    } while (uVar18 < ((long)(sentence->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2) - 1U);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void output_conll(const vector<unsigned>& sentence, const vector<unsigned>& pos,
                  const vector<string>& sentenceUnkStrings, 
                  const map<unsigned, string>& intToWords, 
                  const map<unsigned, string>& intToPos, 
                  const map<int,int>& hyp, const map<int,string>& rel_hyp) {
  for (unsigned i = 0; i < (sentence.size()-1); ++i) {
    auto index = i + 1;
    assert(i < sentenceUnkStrings.size() && 
           ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() > 0) ||
            (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() == 0 &&
             intToWords.find(sentence[i]) != intToWords.end())));
    string wit = (sentenceUnkStrings[i].size() > 0)? 
      sentenceUnkStrings[i] : intToWords.find(sentence[i])->second;
    auto pit = intToPos.find(pos[i]);
    assert(hyp.find(i) != hyp.end());
    auto hyp_head = hyp.find(i)->second + 1;
    if (hyp_head == (int)sentence.size()) hyp_head = 0;
    auto hyp_rel_it = rel_hyp.find(i);
    assert(hyp_rel_it != rel_hyp.end());
    auto hyp_rel = hyp_rel_it->second;
    size_t first_char_in_rel = hyp_rel.find('(') + 1;
    size_t last_char_in_rel = hyp_rel.rfind(')') - 1;
    hyp_rel = hyp_rel.substr(first_char_in_rel, last_char_in_rel - first_char_in_rel + 1);
    cout << index << '\t'       // 1. ID 
         << wit << '\t'         // 2. FORM
         << "_" << '\t'         // 3. LEMMA 
         << "_" << '\t'         // 4. CPOSTAG 
         << pit->second << '\t' // 5. POSTAG
         << "_" << '\t'         // 6. FEATS
         << hyp_head << '\t'    // 7. HEAD
         << hyp_rel << '\t'     // 8. DEPREL
         << "_" << '\t'         // 9. PHEAD
         << "_" << endl;        // 10. PDEPREL
  }
  cout << endl;
}